

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_SelectCoinsBnB_single_Test::TestBody
          (CoinSelection_SelectCoins_Simple_SelectCoinsBnB_single_Test *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  size_type sVar4;
  uint64_t *in_R9;
  Amount AVar5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *in_stack_000001a8;
  AssertionResult gtest_ar;
  string *in_stack_000001c0;
  uint32_t in_stack_000001cc;
  Txid *in_stack_000001d0;
  Utxo *in_stack_000001e0;
  Script *in_stack_000001e8;
  Txid txid;
  TestUtxoCoinVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *__range1;
  iterator ite;
  bool use_bnb;
  Amount tx_fee;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> select_utxos;
  Amount fee_value;
  Amount select_value;
  CoinSelectionOption option_params;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  Amount target_value;
  CoinSelection coin_select;
  reference in_stack_fffffffffffffc18;
  CoinSelectionOption *in_stack_fffffffffffffc20;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffc28;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  string local_320;
  AssertHelper local_300;
  Message local_2f8;
  AssertionResult local_2f0;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined8 local_2d0;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined8 local_2a8;
  int64_t local_2a0;
  AssertionResult local_298;
  AssertHelper local_288;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd80;
  AssertionResult local_268;
  AssertHelper local_258;
  Message local_250;
  undefined4 local_244;
  size_type local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220 [3];
  CoinSelectionOption *in_stack_fffffffffffffdf8;
  UtxoFilter *in_stack_fffffffffffffe00;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffe08;
  Amount *in_stack_fffffffffffffe10;
  CoinSelection *in_stack_fffffffffffffe18;
  Amount *in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe39;
  Amount *in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe49;
  Txid local_1b0;
  Txid local_190;
  reference local_170;
  TestUtxoCoinVector *local_168;
  __normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
  local_160;
  vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *local_158;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_150;
  undefined1 local_141 [17];
  undefined1 local_130 [40];
  undefined1 local_108 [16];
  CoinSelectionOption local_f8;
  uint64_t local_68;
  undefined1 local_60;
  uint64_t local_48;
  undefined1 local_40;
  
  cfd::CoinSelection::CoinSelection
            ((CoinSelection *)in_stack_fffffffffffffc20,
             SUB81((ulong)in_stack_fffffffffffffc18 >> 0x38,0));
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0x93e0a40);
  local_68 = AVar5.amount_;
  local_60 = AVar5.ignore_check_;
  local_48 = local_68;
  local_40 = local_60;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x263035);
  cfd::CoinSelectionOption::CoinSelectionOption(in_stack_fffffffffffffc20);
  cfd::core::Amount::Amount((Amount *)(local_108 + 0x10));
  cfd::core::Amount::Amount((Amount *)local_108);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x26306f);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_141._1_8_ = AVar5.amount_;
  local_141[9] = AVar5.ignore_check_;
  local_141[0] = 0;
  local_130._0_8_ = local_141._1_8_;
  local_130[8] = local_141[9];
  std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>::size
            (&kExtCoinSelectTestVector);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
             CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
             (size_type)in_stack_fffffffffffffc38);
  local_150._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                         ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffc18
                         );
  local_158 = &kExtCoinSelectTestVector;
  local_160._M_current =
       (TestUtxoCoinVector *)
       std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>::begin
                 ((vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *)
                  in_stack_fffffffffffffc18);
  local_168 = (TestUtxoCoinVector *)
              std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>::end
                        ((vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *)
                         in_stack_fffffffffffffc18);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffc20,
                            (__normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffc18), bVar1) {
    local_170 = __gnu_cxx::
                __normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
                ::operator*(&local_160);
    cfd::core::Txid::Txid(&local_190);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      cfd::core::Txid::Txid(&local_1b0,&local_170->txid);
      cfd::core::Txid::operator=(&local_190,&local_1b0);
      cfd::core::Txid::~Txid((Txid *)0x2631ca);
    }
    AVar5 = cfd::core::Amount::CreateBySatoshiAmount(local_170->amount);
    in_stack_fffffffffffffe30 = (Amount *)AVar5.amount_;
    in_stack_fffffffffffffe38 = AVar5.ignore_check_;
    in_stack_fffffffffffffe40 = in_stack_fffffffffffffe30;
    in_stack_fffffffffffffe48 = in_stack_fffffffffffffe38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe10,"",(allocator *)&stack0xfffffffffffffe0f);
    in_stack_fffffffffffffc18 =
         __gnu_cxx::
         __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
         operator*(&local_150);
    in_stack_fffffffffffffc20 = (CoinSelectionOption *)0x0;
    in_R9 = (uint64_t *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              (in_stack_000001d0,in_stack_000001cc,in_stack_000001c0,
               (Amount *)gtest_ar.message_.ptr_,(string *)gtest_ar._0_8_,in_stack_000001a8,
               in_stack_000001e0,in_stack_000001e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe0f);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(&local_150);
    cfd::core::Txid::~Txid((Txid *)0x2633a1);
    __gnu_cxx::
    __normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
    ::operator++(&local_160);
  }
  cfd::CoinSelectionOption::InitializeTxSizeInfo
            ((CoinSelectionOption *)in_stack_fffffffffffffd80.ptr_);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffffc20,(double)in_stack_fffffffffffffc18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffffc30 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_141;
      in_stack_fffffffffffffc28 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_108;
      in_stack_fffffffffffffc20 = (CoinSelectionOption *)(local_108 + 0x10);
      in_stack_fffffffffffffc18 = (reference)local_130;
      in_R9 = &local_f8.effective_fee_baserate_;
      cfd::CoinSelection::SelectCoins
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe30,
                 (Amount *)CONCAT71(in_stack_fffffffffffffe39,in_stack_fffffffffffffe38),
                 in_stack_fffffffffffffe40,
                 (bool *)CONCAT71(in_stack_fffffffffffffe49,in_stack_fffffffffffffe48));
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffc30);
    }
  }
  else {
    testing::Message::Message(local_220);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x1d8,
               "Expected: (select_utxos = coin_select.SelectCoins(target_value, utxos, exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_228,local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message((Message *)0x263590);
  }
  local_240 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size
                        ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_130 + 0x10));
  local_244 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
             (unsigned_long *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x26367f);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x1d9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    testing::Message::~Message((Message *)0x2636dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x263734);
  cfd::core::Amount::GetSatoshiValue((Amount *)(local_108 + 0x10));
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
             (long *)in_stack_fffffffffffffc28,(long *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffd80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2637f7);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x1da,pcVar3);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&stack0xfffffffffffffd80);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message((Message *)0x263854);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2638ac);
  local_2a0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_108);
  local_2a8 = 0xb8;
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
             (long *)in_stack_fffffffffffffc28,(long *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x26396f);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x1db,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message((Message *)0x2639cc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x263a24);
  sVar4 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size
                    ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_130 + 0x10));
  if (sVar4 == 1) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_130 + 0x10),0);
    local_2d0 = 0x93e10e4;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
               (unsigned_long *)in_stack_fffffffffffffc28,(long *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
    if (!bVar1) {
      testing::Message::Message(&local_2d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x263aed);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x1dd,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
      testing::Message::~Message((Message *)0x263b4a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x263b9f);
  }
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffc20,(bool *)in_stack_fffffffffffffc18,
             (type *)0x263bcc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_320,(internal *)&local_2f0,(AssertionResult *)"use_bnb","false","true",
               (char *)in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x1df,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    testing::Message::~Message((Message *)0x263cb2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x263d2a);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffc30);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x263d44);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffc30);
  cfd::CoinSelection::~CoinSelection((CoinSelection *)0x263d5e);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_SelectCoinsBnB_single)
{
  CoinSelection coin_select(true);

  Amount target_value = Amount::CreateBySatoshiAmount(155060800);
  std::vector<Utxo> utxos;
  CoinSelectionOption option_params;
  Amount select_value;
  Amount fee_value;
  std::vector<Utxo> select_utxos;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;

  utxos.resize(kExtCoinSelectTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), "", nullptr,
        &(*ite));
    ++ite;
  }

  option_params.InitializeTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(2);

  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(target_value, utxos,
      exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)));
  EXPECT_EQ(select_utxos.size(), 1);
  EXPECT_EQ(select_value.GetSatoshiValue(), static_cast<int64_t>(155062500));
  EXPECT_EQ(fee_value.GetSatoshiValue(), static_cast<int64_t>(184));
  if (select_utxos.size() == 1) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(155062500));
  }
  EXPECT_TRUE(use_bnb);
}